

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

int instruction_is_valid(m68k_info *info,uint word_check)

{
  uint data;
  int iVar1;
  
  data = info->ir;
  if (((g_instruction_table[data].word2_mask != 0) &&
      ((g_instruction_table[data].word2_mask & word_check) != g_instruction_table[data].word2_match)
      ) || (iVar1 = 1, g_instruction_table[data].instruction == d68000_invalid)) {
    iVar1 = 0;
    build_imm(info,0,data);
  }
  return iVar1;
}

Assistant:

static int instruction_is_valid(m68k_info *info, const unsigned int word_check)
{
	const unsigned int instruction = info->ir;
	instruction_struct *i = &g_instruction_table[instruction];

	if ( (i->word2_mask && ((word_check & i->word2_mask) != i->word2_match)) ||
		(i->instruction == d68000_invalid) ) {
		d68000_invalid(info);
		return 0;
	}

	return 1;
}